

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pMVar3;
  pointer pMVar4;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar5;
  pointer pcVar6;
  double dVar7;
  PrecisionCase *pPVar8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar9;
  undefined8 uVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  Interval *pIVar18;
  IVal *value;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  float *ival;
  undefined1 *puVar20;
  Matrix<float,_4,_4> *val;
  long lVar21;
  long lVar22;
  ulong uVar23;
  IVal reference1;
  IVal in2;
  IVal in3;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ostringstream os;
  ShaderSpec spec;
  ostringstream oss;
  FuncSet funcs;
  undefined1 auStack_658 [8];
  PrecisionCase *local_650;
  IVal local_641;
  string local_640;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_620;
  size_t local_618;
  Statement *local_610;
  ulong local_608;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_600;
  string local_5f8;
  ulong local_5d8;
  ResultCollector *local_5d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_5c8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_598;
  FloatFormat local_568;
  undefined1 local_538 [8];
  pointer pVStack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  VarType local_518 [3];
  ios_base local_4c8 [8];
  ios_base local_4c0 [272];
  undefined1 local_3b0 [56];
  _Alloc_hider local_378;
  size_type local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 local_338 [8];
  pointer pVStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  double local_318;
  Precision local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_308;
  undefined4 local_300;
  ios_base local_2c8 [8];
  ios_base local_2c0 [272];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  _Rb_tree_node_base *local_190;
  double local_188;
  
  pMVar3 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_618 = (long)pMVar4 - (long)pMVar3 >> 6;
  local_620 = variables;
  local_610 = stmt;
  local_600 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_598,local_618);
  local_378._M_p = (pointer)&local_368;
  local_3b0._0_4_ = GLSL_VERSION_300_ES;
  local_3b0._8_8_ = (pointer)0x0;
  local_3b0._16_8_ = (pointer)0x0;
  local_3b0._24_8_ = (pointer)0x0;
  local_3b0._32_8_ = (pointer)0x0;
  local_3b0._40_8_ = (pointer)0x0;
  local_3b0._48_8_ = (pointer)0x0;
  local_370 = 0;
  local_368._M_local_buf[0] = '\0';
  local_358._M_p = (pointer)&local_348;
  local_350 = 0;
  local_348._M_local_buf[0] = '\0';
  local_568.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_568.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_568.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_568.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_568.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_568.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_568.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_568.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_568._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5c8._M_impl.super__Rb_tree_header._M_header;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_538 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_530,"Statement: ",0xb);
  (*local_610->_vptr_Statement[2])(local_610,(ostringstream *)&pVStack_530);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_650 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_530);
  std::ios_base::~ios_base(local_4c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
  p_Var2 = (_Rb_tree_node_base *)(local_1b0 + 8);
  local_1b0._8_4_ = _S_red;
  local_1a0._0_8_ = (_Base_ptr)0x0;
  local_188 = 0.0;
  local_1a0._8_8_ = p_Var2;
  local_190 = p_Var2;
  (*local_610->_vptr_Statement[4])(local_610,local_1b0);
  if ((_Rb_tree_node_base *)local_1a0._8_8_ != p_Var2) {
    p_Var14 = (_Rb_tree_node_base *)local_1a0._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_338);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var2);
  }
  pPVar8 = local_650;
  if (local_188 != 0.0) {
    local_538 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_530);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_530,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_530,local_640._M_dataplus._M_p,local_640._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_530);
    std::ios_base::~ios_base(local_4c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
  std::ios_base::~ios_base(local_2c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,"precision ",10);
  __s = glu::getPrecisionName((pPVar8->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_658 + *(long *)((long)local_538 + -0x18)) + 0x120);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_378,(string *)local_338);
  if (local_338 != (undefined1  [8])&local_328) {
    operator_delete((void *)local_338,
                    CONCAT44(local_328._M_allocated_capacity._4_4_,
                             local_328._M_allocated_capacity._0_4_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
  std::ios_base::~ios_base(local_4c8);
  type.super_ApiType.m_bits = (ApiType)(*((pPVar8->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_3b0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_650->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                   "#extension ",&local_650->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_338);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar19) {
      local_528._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_528._8_8_ = plVar16[3];
      local_538 = (undefined1  [8])&local_528;
    }
    else {
      local_528._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_538 = (undefined1  [8])*plVar16;
    }
    pVStack_530 = (pointer)plVar16[1];
    *plVar16 = (long)paVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_378,(string *)local_538);
    if (local_538 != (undefined1  [8])&local_528) {
      operator_delete((void *)local_538,local_528._M_allocated_capacity + 1);
    }
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,
                      CONCAT44(local_328._M_allocated_capacity._4_4_,
                               local_328._M_allocated_capacity._0_4_) + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_3b0 + 8),1);
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_538,local_650,
             (local_620->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar10 = local_3b0._8_8_;
  std::__cxx11::string::operator=((string *)local_3b0._8_8_,(string *)local_538);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),local_518);
  glu::VarType::~VarType(local_518);
  if (local_538 != (undefined1  [8])&local_528) {
    operator_delete((void *)local_538,local_528._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_3b0 + 0x20),1);
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_538,local_650,
             (local_620->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar10 = local_3b0._32_8_;
  std::__cxx11::string::operator=((string *)local_3b0._32_8_,(string *)local_538);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),local_518);
  glu::VarType::~VarType(local_518);
  if (local_538 != (undefined1  [8])&local_528) {
    operator_delete((void *)local_538,local_528._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
  pPVar8 = local_650;
  (*local_610->_vptr_Statement[2])(local_610,local_538);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
  std::ios_base::~ios_base(local_4c8);
  std::__cxx11::string::operator=((string *)&local_358,(string *)local_338);
  if (local_338 != (undefined1  [8])&local_328) {
    operator_delete((void *)local_338,
                    CONCAT44(local_328._M_allocated_capacity._4_4_,
                             local_328._M_allocated_capacity._0_4_) + 1);
  }
  pSVar17 = ShaderExecUtil::createExecutor
                      ((pPVar8->m_ctx).renderContext,(pPVar8->m_ctx).shaderType,
                       (ShaderSpec *)local_3b0);
  local_538 = (undefined1  [8])
              (local_600->in0).
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_530 = (local_600->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_528._M_allocated_capacity =
       (size_type)
       (local_600->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_528._8_8_ =
       (local_600->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_338 = (undefined1  [8])
              local_598.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_330 = local_598.out1.
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar8->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  ival = (float *)local_338;
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,local_618,local_538);
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_538);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_338);
  pVVar9 = local_620;
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_5c8,
             (local_620->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_538);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_5c8,
             (pVVar9->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_1b0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_5c8,
             (pVVar9->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_640);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_5c8,
             (pVVar9->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5f8);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_5c8,
             (pVVar9->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_338);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_5c8,
             (pVVar9->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_641);
  pPVar8 = local_650;
  if (pMVar4 == pMVar3) {
LAB_017bc21e:
    local_538 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_530);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_530,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_530);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_530," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    fmt = &(local_650->m_ctx).floatFormat;
    local_5d0 = &local_650->m_status;
    local_5d8 = local_618 + (local_618 == 0);
    uVar23 = 0;
    local_608 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_538);
      if ((uVar23 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_650->super_TestCase).super_TestNode.m_testCtx);
      }
      round<tcu::Matrix<float,4,4>>
                ((IVal *)local_1b0,(BuiltinPrecisionTests *)fmt,
                 (FloatFormat *)
                 ((local_600->in0).
                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar23),(Matrix<float,_4,_4> *)ival);
      pVVar9 = local_620;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_338,fmt,(IVal *)local_1b0);
      pIVar18 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_5c8,
                           (pVVar9->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      puVar20 = local_338;
      lVar21 = 0;
      do {
        lVar22 = 0;
        do {
          *(undefined8 *)((long)&pIVar18->m_hi + lVar22) = *(undefined8 *)(puVar20 + lVar22 + 0x10);
          dVar7 = *(double *)((long)(puVar20 + lVar22) + 8);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar18->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar22;
          *(undefined8 *)pbVar1 = *(undefined8 *)(puVar20 + lVar22);
          *(double *)(pbVar1 + 8) = dVar7;
          lVar22 = lVar22 + 0x60;
        } while (lVar22 != 0x180);
        lVar21 = lVar21 + 1;
        pIVar18 = pIVar18 + 1;
        puVar20 = puVar20 + 0x18;
      } while (lVar21 != 4);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_5c8,
                 (pVVar9->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_5c8,
                 (pVVar9->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_5c8,
                 (pVVar9->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_310 = (local_650->m_ctx).precision;
      local_318 = (pPVar8->m_ctx).floatFormat.m_maxValue;
      local_338 = *(undefined1 (*) [8])fmt;
      pVStack_330 = *(pointer *)&(pPVar8->m_ctx).floatFormat.m_fractionBits;
      local_328._M_allocated_capacity._0_4_ = (pPVar8->m_ctx).floatFormat.m_hasInf;
      local_328._M_allocated_capacity._4_4_ = (pPVar8->m_ctx).floatFormat.m_hasNaN;
      local_328._8_4_ = *(undefined4 *)&(pPVar8->m_ctx).floatFormat.m_exactPrecision;
      local_328._12_4_ = *(undefined4 *)&(pPVar8->m_ctx).floatFormat.field_0x1c;
      local_300 = 0;
      local_308 = &local_5c8;
      (*local_610->_vptr_Statement[3])(local_610,local_338);
      value = Environment::lookup<tcu::Matrix<float,4,4>>
                        ((Environment *)&local_5c8,
                         (pVVar9->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                         .m_ptr);
      pIVar18 = (Interval *)local_338;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)pIVar18,&local_568,value);
      ival = (float *)local_538;
      lVar21 = 0;
      do {
        lVar22 = 0;
        do {
          *(undefined8 *)((long)ival + lVar22 + 0x10) =
               *(undefined8 *)((long)&pIVar18->m_hi + lVar22);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar18->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar22;
          dVar7 = *(double *)(pbVar1 + 8);
          *(undefined8 *)((long)ival + lVar22) = *(undefined8 *)pbVar1;
          ((undefined8 *)((long)ival + lVar22))[1] = dVar7;
          lVar22 = lVar22 + 0x60;
        } while (lVar22 != 0x180);
        lVar21 = lVar21 + 1;
        ival = ival + 6;
        pIVar18 = pIVar18 + 1;
      } while (lVar21 != 4);
      bVar11 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_538,
                          (Matrix<float,_4,_4> *)
                          ((long)local_598.out0.
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar23 * 4 * 0x10));
      local_338 = (undefined1  [8])&local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_5d0,bVar11,(string *)local_338);
      if (local_338 != (undefined1  [8])&local_328) {
        operator_delete((void *)local_338,
                        CONCAT44(local_328._M_allocated_capacity._4_4_,
                                 local_328._M_allocated_capacity._0_4_) + 1);
      }
      pVVar9 = local_620;
      if (!bVar11) {
        uVar13 = (int)local_608 + 1;
        local_608 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_338 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_330);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330,"\t",1);
          pVVar5 = (pVVar9->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          val = (Matrix<float,_4,_4> *)local_1a0;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_1b0._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_330,(char *)local_1b0._0_8_,
                     CONCAT44(local_1b0._12_4_,local_1b0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_640,(BuiltinPrecisionTests *)&local_568,
                     (FloatFormat *)
                     ((local_600->in0).
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar23),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_330,local_640._M_dataplus._M_p,local_640._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._M_dataplus._M_p != &local_640.field_2) {
            operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_4,_4> *)local_1b0._0_8_ != (Matrix<float,_4,_4> *)local_1a0) {
            operator_delete((void *)local_1b0._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_1a0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330,"\t",1);
          pVVar5 = (pVVar9->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          ival = (float *)local_1a0;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_1b0._0_8_ = ival;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_330,(char *)local_1b0._0_8_,
                     CONCAT44(local_1b0._12_4_,local_1b0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_640,(BuiltinPrecisionTests *)&local_568,
                     (FloatFormat *)
                     ((long)local_598.out0.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar23 * 4 * 0x10),
                     (Matrix<float,_4,_4> *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_330,local_640._M_dataplus._M_p,local_640._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_330,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,4>>
                    (&local_5f8,(BuiltinPrecisionTests *)&local_568,(FloatFormat *)local_538,
                     (IVal *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_330,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_330,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
            operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._M_dataplus._M_p != &local_640.field_2) {
            operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1b0._0_8_ != local_1a0) {
            operator_delete((void *)local_1b0._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_1a0._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_330);
          std::ios_base::~ios_base(local_2c0);
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != local_5d8);
    iVar12 = (int)local_608;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_017bc21e;
    }
    else {
      local_538 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_530);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_530,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_530,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_530," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_530);
      std::ios_base::~ios_base(local_4c0);
    }
    local_538 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_530);
    std::ostream::operator<<((ostringstream *)&pVStack_530,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_530,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_530);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_530," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_530);
  std::ios_base::~ios_base(local_4c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_5c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_p != &local_348) {
    operator_delete(local_358._M_p,
                    CONCAT71(local_348._M_allocated_capacity._1_7_,local_348._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_p != &local_368) {
    operator_delete(local_378._M_p,
                    CONCAT71(local_368._M_allocated_capacity._1_7_,local_368._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_3b0 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_3b0 + 8));
  if (local_598.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.out0.
         super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_598.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}